

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.cpp
# Opt level: O3

uint32_t __thiscall mjs::gc_heap::gc_move(gc_heap *this,uint32_t pos)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  slot *psVar5;
  undefined8 *puVar6;
  slot *psVar7;
  gc_heap_ptr_untyped **ppgVar8;
  slot *psVar9;
  uint uVar10;
  uint32_t uVar11;
  uint uVar12;
  slot *psVar13;
  ulong uVar14;
  uint32_t uVar15;
  ulong uVar16;
  allocation_result aVar17;
  slot *local_38;
  
  uVar10 = (this->gc_state_).level + 1;
  (this->gc_state_).level = uVar10;
  if (3 < uVar10) {
    __assert_fail("l < 4 && \"Arbitrary recursion level reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                  ,0x56,"mjs::gc_heap::gc_move(const uint32_t)::auto_level::auto_level(uint32_t &)")
    ;
  }
  uVar12 = pos - 1;
  uVar10 = (this->alloc_context_).start_;
  if (uVar10 <= uVar12) {
    uVar1 = (this->alloc_context_).next_free_;
    if (uVar12 < uVar1) {
      psVar5 = (this->alloc_context_).storage_;
      uVar16 = (ulong)uVar12;
      uVar2 = *(uint *)((long)psVar5 + uVar16 * 8 + 4);
      if (uVar2 == 0xffffffff) {
        __assert_fail("a.type != uninitialized_type_index",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                      ,0x5e,"uint32_t mjs::gc_heap::gc_move(const uint32_t)");
      }
      uVar3 = psVar5[uVar16].new_position;
      if ((uVar3 < 2) || (uVar1 - uVar12 < uVar3)) {
        __assert_fail("a.size > 1 && a.size <= alloc_context_.next_free() - (pos - 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                      ,0x5f,"uint32_t mjs::gc_heap::gc_move(const uint32_t)");
      }
      if (uVar2 == 0xfffffffe) {
        if ((uVar10 <= pos) && (pos < uVar1)) {
          uVar11 = psVar5[pos].new_position;
LAB_00139770:
          (this->gc_state_).level = (this->gc_state_).level - 1;
          return uVar11;
        }
      }
      else {
        if (gc_type_info::num_types_ <= uVar2) {
          __assert_fail("a.type < gc_type_info::num_types()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                        ,0x65,"uint32_t mjs::gc_heap::gc_move(const uint32_t)");
        }
        aVar17 = allocation_context::allocate((this->gc_state_).new_context,(ulong)(uVar3 * 8 - 8));
        psVar13 = aVar17.obj;
        if ((*(int *)((long)psVar13 - 4) != -1) ||
           (uVar11 = aVar17.pos, psVar13[-1].new_position != psVar5[uVar16].new_position)) {
          __assert_fail("new_obj.hdr().type == uninitialized_type_index && new_obj.hdr().size == a.size"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                        ,0x69,"uint32_t mjs::gc_heap::gc_move(const uint32_t)");
        }
        uVar10 = *(uint *)((long)psVar5 + uVar16 * 8 + 4);
        if (gc_type_info::num_types_ <= uVar10) {
          __assert_fail("index < num_types_",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h"
                        ,0x44,"static const gc_type_info &mjs::gc_type_info::from_index(uint32_t)");
        }
        if (((this->alloc_context_).start_ <= pos) && (pos < (this->alloc_context_).next_free_)) {
          uVar4 = (this->pointers_).size_;
          puVar6 = *(undefined8 **)(gc_type_info::types_ + (ulong)uVar10 * 8);
          psVar7 = (this->alloc_context_).storage_;
          (*(code *)puVar6[1])(psVar13);
          *(undefined4 *)((long)psVar13 - 4) = *(undefined4 *)((long)psVar5 + uVar16 * 8 + 4);
          uVar10 = (this->pointers_).size_ - uVar4;
          uVar14 = (ulong)uVar10;
          if (uVar10 != 0) {
            ppgVar8 = (this->pointers_).set_;
            uVar15 = uVar4;
            do {
              psVar9 = (slot *)ppgVar8[uVar15];
              if ((psVar9 < psVar13) ||
                 (psVar13 + ((ulong)psVar5[uVar16].new_position - 1) <= psVar9)) {
                __assert_fail("reinterpret_cast<uintptr_t>(ps[num_pointers_initially+i]) >= reinterpret_cast<uintptr_t>(new_obj.obj) && reinterpret_cast<uintptr_t>(ps[num_pointers_initially+i]) < reinterpret_cast<uintptr_t>(new_obj.obj + a.size - 1)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                              ,0x7b,"uint32_t mjs::gc_heap::gc_move(const uint32_t)");
              }
              local_38 = psVar9 + 1;
              std::vector<unsigned_int*,std::allocator<unsigned_int*>>::emplace_back<unsigned_int*>
                        ((vector<unsigned_int*,std::allocator<unsigned_int*>> *)
                         &(this->gc_state_).pending_fixups,(uint **)&local_38);
              uVar15 = uVar15 + 1;
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
          }
          if ((code *)*puVar6 != (code *)0x0) {
            (*(code *)*puVar6)(psVar7 + pos);
          }
          if ((this->pointers_).size_ != uVar4) {
            __assert_fail("pointers_.size() == num_pointers_initially",
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp"
                          ,0x84,"uint32_t mjs::gc_heap::gc_move(const uint32_t)");
          }
          *(undefined4 *)((long)psVar5 + uVar16 * 8 + 4) = 0xfffffffe;
          if (((this->alloc_context_).start_ <= pos) && (pos < (this->alloc_context_).next_free_)) {
            (this->alloc_context_).storage_[pos].new_position = uVar11;
            if ((code *)puVar6[2] != (code *)0x0) {
              (*(code *)puVar6[2])(psVar13);
            }
            goto LAB_00139770;
          }
        }
      }
      __assert_fail("pos_inside(pos)",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h"
                    ,0x13a,"slot *mjs::gc_heap::allocation_context::get_at(uint32_t) const");
    }
  }
  __assert_fail("alloc_context_.pos_inside(pos-1)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.cpp",
                0x5b,"uint32_t mjs::gc_heap::gc_move(const uint32_t)");
}

Assistant:

auto_level(uint32_t& l) : l(l) { ++l; assert(l < 4 && "Arbitrary recursion level reached"); }